

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O0

void LowererMD::ReverseBranch(BranchInstr *branchInstr)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  BranchInstr *branchInstr_local;
  
  switch(*(int *)&(branchInstr->super_Instr).m_opcode - 0x41dU & 0xffff) {
  case 0:
    (branchInstr->super_Instr).m_opcode = JB;
    break;
  case 1:
    (branchInstr->super_Instr).m_opcode = JBE;
    break;
  case 2:
    (branchInstr->super_Instr).m_opcode = JA;
    break;
  case 3:
    (branchInstr->super_Instr).m_opcode = JAE;
    break;
  case 4:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
    break;
  case 5:
    (branchInstr->super_Instr).m_opcode = JLE;
    break;
  case 6:
    (branchInstr->super_Instr).m_opcode = JLT;
    break;
  case 7:
    (branchInstr->super_Instr).m_opcode = JGE;
    break;
  case 8:
    (branchInstr->super_Instr).m_opcode = JGT;
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0xb6,"((0))","JCC missing in ReverseBranch()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return;
}

Assistant:

void
LowererMD::ReverseBranch(IR::BranchInstr *branchInstr)
{
    switch (branchInstr->m_opcode)
    {
    case Js::OpCode::JA:
        branchInstr->m_opcode = Js::OpCode::JB;
        break;
    case Js::OpCode::JAE:
        branchInstr->m_opcode = Js::OpCode::JBE;
        break;
    case Js::OpCode::JB:
        branchInstr->m_opcode = Js::OpCode::JA;
        break;
    case Js::OpCode::JBE:
        branchInstr->m_opcode = Js::OpCode::JAE;
        break;
    case Js::OpCode::JGE:
        branchInstr->m_opcode = Js::OpCode::JLE;
        break;
    case Js::OpCode::JGT:
        branchInstr->m_opcode = Js::OpCode::JLT;
        break;
    case Js::OpCode::JLT:
        branchInstr->m_opcode = Js::OpCode::JGT;
        break;
    case Js::OpCode::JLE:
        branchInstr->m_opcode = Js::OpCode::JGE;
        break;
    case Js::OpCode::JEQ:
    case Js::OpCode::JNE:
    case Js::OpCode::JO:
    case Js::OpCode::JNO:
    case Js::OpCode::JP:
    case Js::OpCode::JNP:
    case Js::OpCode::JSB:
    case Js::OpCode::JNSB:
        break;
    default:
        AssertMsg(UNREACHED, "JCC missing in ReverseBranch()");
    }
}